

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget,QTouchEvent *touchEvent)

{
  long lVar1;
  QPointF arg;
  char cVar2;
  qsizetype qVar3;
  qreal qVar4;
  longlong in_RSI;
  qreal in_RDI;
  long in_FS_OFFSET;
  QEventPoint *pt;
  int i;
  bool containsPress;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  qreal qVar5;
  QPointF in_stack_ffffffffffffffb8;
  undefined4 local_30;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_29 = false;
  local_30 = 0;
  while( true ) {
    qVar3 = QPointerEvent::pointCount((QPointerEvent *)0x2d4d31);
    if (qVar3 <= local_30) break;
    qVar4 = (qreal)QPointerEvent::point(in_RSI);
    qVar5 = in_RDI;
    QEventPoint::globalPosition();
    in_stack_ffffffffffffffb8 =
         QWidget::mapFromGlobal
                   ((QWidget *)in_stack_ffffffffffffffb8.yp,(QPointF *)in_stack_ffffffffffffffb8.xp)
    ;
    arg.yp = qVar4;
    arg.xp = qVar5;
    QMutableEventPoint::setPosition
              ((QEventPoint *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),arg);
    cVar2 = QEventPoint::state();
    if (cVar2 == '\x01') {
      local_29 = true;
    }
    local_30 = local_30 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::updateTouchPointsForWidget(QWidget *widget, QTouchEvent *touchEvent)
{
    bool containsPress = false;

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, widget->mapFromGlobal(pt.globalPosition()));

        if (pt.state() == QEventPoint::State::Pressed)
            containsPress = true;
    }
    return containsPress;
}